

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O2

size_t __thiscall
adios2::format::ChunkV::AddToVec
          (ChunkV *this,size_t size,void *buf,size_t align,bool CopyReqd,MemorySpace MemSpace)

{
  Chunk *v;
  size_t *psVar1;
  pointer pVVar2;
  size_t sVar3;
  pointer pCVar4;
  size_t sVar5;
  ulong size_00;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  VecEntry entry;
  Chunk c;
  value_type local_68;
  Chunk local_48;
  
  BufferV::AlignBuffer(&this->super_BufferV,align);
  sVar7 = (this->super_BufferV).CurOffset;
  if (size == 0) {
    return sVar7;
  }
  if ((CopyReqd) || ((this->super_BufferV).m_AlwaysCopy != false)) {
    pVVar2 = (this->super_BufferV).DataV.
             super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pVVar2 != (this->super_BufferV).DataV.
                   super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start) && (pVVar2[-1].External == false)) {
      sVar3 = this->m_TailChunkPos;
      pcVar8 = this->m_TailChunk->Ptr + sVar3;
      if (pcVar8 + -pVVar2[-1].Size == (char *)pVVar2[-1].Base) {
        if (sVar3 + size <= this->m_ChunkSize) {
          memcpy(pcVar8,buf,size);
          psVar1 = &(this->super_BufferV).DataV.
                    super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].Size;
          *psVar1 = *psVar1 + size;
          this->m_TailChunkPos = this->m_TailChunkPos + size;
          goto LAB_004e9304;
        }
        pCVar4 = (this->m_Chunks).
                 super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        v = pCVar4 + -1;
        sVar5 = ChunkAlloc(this,v,sVar3);
        sVar3 = this->m_TailChunkPos;
        pcVar8 = pCVar4[-1].Ptr;
        sVar6 = sVar3;
        if (sVar5 != sVar3) {
          for (; sVar5 != sVar6; sVar6 = sVar6 + 1) {
            pcVar8[sVar6] = '\0';
          }
          pcVar8 = v->Ptr;
        }
        sVar7 = (sVar5 + sVar7) - sVar3;
        pVVar2 = (this->super_BufferV).DataV.
                 super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pVVar2[-1].Size = sVar5;
        pVVar2[-1].Base = pcVar8;
        this->m_TailChunkPos = 0;
        this->m_TailChunk = (Chunk *)0x0;
      }
    }
    size_00 = this->m_ChunkSize;
    if (this->m_ChunkSize <= size) {
      size_00 = size;
    }
    local_48.Ptr = (char *)0x0;
    local_48.AllocatedPtr = (void *)0x0;
    local_48.Size = 0;
    ChunkAlloc(this,&local_48,size_00);
    std::vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>::
    push_back(&this->m_Chunks,&local_48);
    pCVar4 = (this->m_Chunks).
             super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this->m_TailChunk = pCVar4 + -1;
    memcpy(pCVar4[-1].Ptr,buf,size);
    this->m_TailChunkPos = size;
    local_68.External = false;
    local_68.Base = this->m_TailChunk->Ptr;
  }
  else {
    local_68.External = true;
    local_68.Base = buf;
  }
  local_68.Offset = 0;
  local_68.Size = size;
  std::vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  ::push_back(&(this->super_BufferV).DataV,&local_68);
LAB_004e9304:
  (this->super_BufferV).CurOffset = size + sVar7;
  return sVar7;
}

Assistant:

size_t ChunkV::AddToVec(const size_t size, const void *buf, size_t align, bool CopyReqd,
                        MemorySpace MemSpace)
{
    AlignBuffer(align); // may call back AddToVec recursively
    size_t retOffset = CurOffset;

    if (size == 0)
    {
        return CurOffset;
    }

    /* std::cout << "  AddToVec: size = " << size << " copy = " << CopyReqd
              << std::endl; */
    if (!CopyReqd && !m_AlwaysCopy)
    {
        /*std::cout << "    add external = " << size << std::endl;*/
        // just add buf to internal version of output vector
        VecEntry entry = {true, buf, 0, size};
        DataV.push_back(entry);
    }
    else
    {
        // we can possibly append this entry to the last if the last was
        // internal
        bool AppendPossible =
            DataV.size() && !DataV.back().External &&
            (m_TailChunk->Ptr + m_TailChunkPos - DataV.back().Size == DataV.back().Base);

        if (AppendPossible && (m_TailChunkPos + size > m_ChunkSize))
        {
            // No room in current chunk, close it out
            // realloc down to used size (helpful?) and set size in array
            /*std::cout << "    downsize ptr = " << m_Chunks.back().Ptr
                      << " to size = " << m_TailChunkPos << std::endl;*/
            Chunk &c = m_Chunks.back();
            size_t actualsize = ChunkAlloc(c, m_TailChunkPos);
            size_t alignment = actualsize - m_TailChunkPos;
            if (alignment)
            {
                auto p = c.Ptr + m_TailChunkPos;
                std::fill(p, p + alignment, 0);
            }
            retOffset += alignment;
            // Update entry in DataV as size and potentiall ptr has changed
            // Learned from sanitizer: downsizing realloc still may change pointer
            VecEntry &dv = DataV.back();
            dv.Size = actualsize;
            dv.Base = c.Ptr;
            m_TailChunkPos = 0;
            m_TailChunk = nullptr;
            AppendPossible = false;
        }
        if (AppendPossible)
        {
            // We can use current chunk, just append the data;
            /*std::cout << "    append to current chunk ptr = "
                      << m_TailChunk->Ptr << " at pos = " << m_TailChunkPos
                      << " add size = " << size << std::endl; */
            CopyDataToBuffer(size, buf, m_TailChunkPos, MemSpace);
            DataV.back().Size += size;
            m_TailChunkPos += size;
        }
        else
        {
            // We need a new chunk, get the larger of size or m_ChunkSize
            /*  std::cout << "    get a new chunk size = " << m_ChunkSize
                      << std::endl; */
            size_t NewSize = m_ChunkSize;
            if (size > m_ChunkSize)
                NewSize = size;
            Chunk c{nullptr, nullptr, 0};
            ChunkAlloc(c, NewSize);
            m_Chunks.push_back(c);
            m_TailChunk = &m_Chunks.back();
            CopyDataToBuffer(size, buf, 0, MemSpace);
            m_TailChunkPos = size;
            VecEntry entry = {false, m_TailChunk->Ptr, 0, size};
            DataV.push_back(entry);
        }
    }
    CurOffset = retOffset + size;
    return retOffset;
}